

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O2

int pair1_set_test_inject_header(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)((long)arg + 0x20));
  iVar1 = nni_copyin_bool((_Bool *)((long)arg + 0x330),buf,sz,t);
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x20));
  return iVar1;
}

Assistant:

static int
pair1_set_test_inject_header(void *arg, const void *buf, size_t sz, nni_type t)
{
	pair1_sock *s = arg;
	int         rv;
	nni_mtx_lock(&s->mtx);
	rv = nni_copyin_bool(&s->inject_header, buf, sz, t);
	nni_mtx_unlock(&s->mtx);
	return (rv);
}